

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring.c
# Opt level: O1

pchar * p_strchomp(pchar *str)

{
  size_t sVar1;
  ushort **ppuVar2;
  pchar *ppVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (str != (pchar *)0x0) {
    sVar1 = strlen(str);
    lVar4 = sVar1 - 1;
    if ((long)sVar1 < 2) {
      lVar6 = 0;
    }
    else {
      ppuVar2 = __ctype_b_loc();
      lVar5 = 0;
      do {
        lVar6 = lVar5;
        if ((*(byte *)((long)*ppuVar2 + (ulong)(byte)str[lVar5] * 2 + 1) & 0x20) == 0) break;
        lVar5 = lVar5 + 1;
        lVar6 = lVar4;
      } while (lVar4 != lVar5);
    }
    if (1 < (long)sVar1) {
      ppuVar2 = __ctype_b_loc();
      lVar4 = 0;
      do {
        if ((*(byte *)((long)*ppuVar2 + (ulong)(byte)str[sVar1 - 1] * 2 + 1) & 0x20) == 0) {
          lVar4 = sVar1 - 1;
          break;
        }
        sVar1 = sVar1 - 1;
      } while (1 < (long)sVar1);
    }
    lVar5 = lVar4 - lVar6;
    if ((lVar4 < lVar6) ||
       ((lVar5 == 0 &&
        (ppuVar2 = __ctype_b_loc(),
        (*(byte *)((long)*ppuVar2 + (ulong)(byte)str[lVar4] * 2 + 1) & 0x20) != 0)))) {
      ppVar3 = p_strdup("");
      return ppVar3;
    }
    ppVar3 = (pchar *)p_malloc0(lVar5 + 2);
    if (ppVar3 != (pchar *)0x0) {
      memcpy(ppVar3,str + lVar6,lVar5 + 1);
      ppVar3[lVar5 + 1] = '\0';
      return ppVar3;
    }
  }
  return (pchar *)0x0;
}

Assistant:

P_LIB_API pchar *
p_strchomp (const pchar *str)
{
	pssize		pos_start;
	pssize		pos_end;
	psize		str_len;
	pchar		*ret;
	const pchar	*ptr;

	if (P_UNLIKELY (str == NULL))
		return NULL;

	ptr       = str;
	pos_start = 0;
	pos_end   = ((pssize) strlen (str)) - 1;

	while (pos_start < pos_end && isspace (* ((const puchar *) ptr++)))
		++pos_start;

	ptr = str + pos_end;

	while (pos_end > 0 && isspace (* ((const puchar *) ptr--)))
		--pos_end;

	if (pos_end < pos_start)
		return p_strdup ("\0");

	if (pos_end == pos_start && isspace (* ((const puchar *) (str + pos_end))))
		return p_strdup ("\0");

	str_len = (psize) (pos_end - pos_start + 2);

	if (P_UNLIKELY ((ret = p_malloc0 (str_len)) == NULL))
		return NULL;

	memcpy (ret, str + pos_start, str_len - 1);
	*(ret + str_len - 1) = '\0';

	return ret;
}